

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O1

int gladLoadGLLoader(GLADloadproc load)

{
  char **__ptr;
  int iVar1;
  uint uVar2;
  GLubyte *pGVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  bool bVar10;
  int minor;
  int major;
  int local_38;
  int local_34;
  
  GLVersion.major = 0;
  GLVersion.minor = 0;
  glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
  uVar2 = 0;
  if ((glad_glGetString != (PFNGLGETSTRINGPROC)0x0) &&
     (pGVar3 = (*glad_glGetString)(0x1f02), pGVar3 != (GLubyte *)0x0)) {
    pGVar3 = (*glad_glGetString)(0x1f02);
    if (pGVar3 != (GLubyte *)0x0) {
      lVar8 = 0;
      do {
        pcVar5 = *(char **)((long)&PTR_anon_var_dwarf_a9c69_001affe0 + lVar8);
        sVar4 = strlen(pcVar5);
        iVar1 = strncmp((char *)pGVar3,pcVar5,sVar4);
        if (iVar1 != 0) {
          sVar4 = 0;
        }
        pGVar3 = pGVar3 + sVar4;
      } while ((iVar1 != 0) && (bVar10 = lVar8 != 0x10, lVar8 = lVar8 + 8, bVar10));
      __isoc99_sscanf(pGVar3,"%d.%d",&local_34,&local_38);
      GLAD_GL_VERSION_1_5 = (int)(1 < local_34);
      uVar9 = (uint)(3 < local_34);
      uVar2 = (uint)(1 < local_34);
      GLAD_GL_VERSION_3_2 = uVar9;
      GLAD_GL_VERSION_1_2 = uVar2;
      if (1 < local_38) {
        GLAD_GL_VERSION_1_2 = 1;
        GLAD_GL_VERSION_3_2 = 1;
      }
      uVar7 = (uint)(2 < local_34);
      if (local_34 != 3) {
        GLAD_GL_VERSION_3_2 = uVar9;
      }
      bVar10 = -1 < local_38;
      GLAD_GL_VERSION_1_0 = GLAD_GL_VERSION_1_5;
      if (bVar10) {
        GLAD_GL_VERSION_1_0 = 1;
      }
      GLAD_GL_VERSION_1_1 = GLAD_GL_VERSION_1_5;
      if (0 < local_38) {
        GLAD_GL_VERSION_1_1 = 1;
      }
      GLAD_GL_VERSION_2_0 = uVar7;
      if (bVar10) {
        GLAD_GL_VERSION_2_0 = 1;
      }
      GLAD_GL_VERSION_2_1 = uVar7;
      if (0 < local_38) {
        GLAD_GL_VERSION_2_1 = 1;
      }
      GLAD_GL_VERSION_3_0 = uVar9;
      if (bVar10) {
        GLAD_GL_VERSION_3_0 = 1;
      }
      GLAD_GL_VERSION_3_1 = uVar9;
      if (0 < local_38) {
        GLAD_GL_VERSION_3_1 = 1;
      }
      bVar10 = local_34 == 3;
      if (!bVar10) {
        GLAD_GL_VERSION_3_1 = uVar9;
        GLAD_GL_VERSION_3_0 = uVar9;
      }
      if (local_34 != 2) {
        GLAD_GL_VERSION_2_1 = uVar7;
        GLAD_GL_VERSION_2_0 = uVar7;
      }
      GLAD_GL_VERSION_1_3 = GLAD_GL_VERSION_1_5;
      if (2 < local_38) {
        GLAD_GL_VERSION_1_3 = 1;
      }
      GLAD_GL_VERSION_1_4 = GLAD_GL_VERSION_1_5;
      if (3 < local_38) {
        GLAD_GL_VERSION_1_4 = 1;
      }
      if (4 < local_38) {
        GLAD_GL_VERSION_1_5 = 1;
      }
      GLVersion.minor = local_38;
      GLVersion.major = local_34;
      if (local_34 != 1) {
        GLAD_GL_VERSION_1_0 = uVar2;
      }
      max_loaded_major = local_34;
      if (local_34 != 1) {
        GLAD_GL_VERSION_1_5 = uVar2;
        GLAD_GL_VERSION_1_2 = uVar2;
        GLAD_GL_VERSION_1_1 = uVar2;
        GLAD_GL_VERSION_1_3 = uVar2;
        GLAD_GL_VERSION_1_4 = uVar2;
      }
      GLAD_GL_VERSION_3_3 = 1;
      if (2 >= local_38 || !bVar10) {
        GLAD_GL_VERSION_3_3 = uVar9;
      }
      if (3 < local_34 || 2 < local_38 && bVar10) {
        max_loaded_major = 3;
      }
    }
    if (GLAD_GL_VERSION_1_0 != 0) {
      glad_glCullFace = (PFNGLCULLFACEPROC)(*load)("glCullFace");
      glad_glFrontFace = (PFNGLFRONTFACEPROC)(*load)("glFrontFace");
      glad_glHint = (PFNGLHINTPROC)(*load)("glHint");
      glad_glLineWidth = (PFNGLLINEWIDTHPROC)(*load)("glLineWidth");
      glad_glPointSize = (PFNGLPOINTSIZEPROC)(*load)("glPointSize");
      glad_glPolygonMode = (PFNGLPOLYGONMODEPROC)(*load)("glPolygonMode");
      glad_glScissor = (PFNGLSCISSORPROC)(*load)("glScissor");
      glad_glTexParameterf = (PFNGLTEXPARAMETERFPROC)(*load)("glTexParameterf");
      glad_glTexParameterfv = (PFNGLTEXPARAMETERFVPROC)(*load)("glTexParameterfv");
      glad_glTexParameteri = (PFNGLTEXPARAMETERIPROC)(*load)("glTexParameteri");
      glad_glTexParameteriv = (PFNGLTEXPARAMETERIVPROC)(*load)("glTexParameteriv");
      glad_glTexImage1D = (PFNGLTEXIMAGE1DPROC)(*load)("glTexImage1D");
      glad_glTexImage2D = (PFNGLTEXIMAGE2DPROC)(*load)("glTexImage2D");
      glad_glDrawBuffer = (PFNGLDRAWBUFFERPROC)(*load)("glDrawBuffer");
      glad_glClear = (PFNGLCLEARPROC)(*load)("glClear");
      glad_glClearColor = (PFNGLCLEARCOLORPROC)(*load)("glClearColor");
      glad_glClearStencil = (PFNGLCLEARSTENCILPROC)(*load)("glClearStencil");
      glad_glClearDepth = (PFNGLCLEARDEPTHPROC)(*load)("glClearDepth");
      glad_glStencilMask = (PFNGLSTENCILMASKPROC)(*load)("glStencilMask");
      glad_glColorMask = (PFNGLCOLORMASKPROC)(*load)("glColorMask");
      glad_glDepthMask = (PFNGLDEPTHMASKPROC)(*load)("glDepthMask");
      glad_glDisable = (PFNGLDISABLEPROC)(*load)("glDisable");
      glad_glEnable = (PFNGLENABLEPROC)(*load)("glEnable");
      glad_glFinish = (PFNGLFINISHPROC)(*load)("glFinish");
      glad_glFlush = (PFNGLFLUSHPROC)(*load)("glFlush");
      glad_glBlendFunc = (PFNGLBLENDFUNCPROC)(*load)("glBlendFunc");
      glad_glLogicOp = (PFNGLLOGICOPPROC)(*load)("glLogicOp");
      glad_glStencilFunc = (PFNGLSTENCILFUNCPROC)(*load)("glStencilFunc");
      glad_glStencilOp = (PFNGLSTENCILOPPROC)(*load)("glStencilOp");
      glad_glDepthFunc = (PFNGLDEPTHFUNCPROC)(*load)("glDepthFunc");
      glad_glPixelStoref = (PFNGLPIXELSTOREFPROC)(*load)("glPixelStoref");
      glad_glPixelStorei = (PFNGLPIXELSTOREIPROC)(*load)("glPixelStorei");
      glad_glReadBuffer = (PFNGLREADBUFFERPROC)(*load)("glReadBuffer");
      glad_glReadPixels = (PFNGLREADPIXELSPROC)(*load)("glReadPixels");
      glad_glGetBooleanv = (PFNGLGETBOOLEANVPROC)(*load)("glGetBooleanv");
      glad_glGetDoublev = (PFNGLGETDOUBLEVPROC)(*load)("glGetDoublev");
      glad_glGetError = (PFNGLGETERRORPROC)(*load)("glGetError");
      glad_glGetFloatv = (PFNGLGETFLOATVPROC)(*load)("glGetFloatv");
      glad_glGetIntegerv = (PFNGLGETINTEGERVPROC)(*load)("glGetIntegerv");
      glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
      glad_glGetTexImage = (PFNGLGETTEXIMAGEPROC)(*load)("glGetTexImage");
      glad_glGetTexParameterfv = (PFNGLGETTEXPARAMETERFVPROC)(*load)("glGetTexParameterfv");
      glad_glGetTexParameteriv = (PFNGLGETTEXPARAMETERIVPROC)(*load)("glGetTexParameteriv");
      glad_glGetTexLevelParameterfv =
           (PFNGLGETTEXLEVELPARAMETERFVPROC)(*load)("glGetTexLevelParameterfv");
      glad_glGetTexLevelParameteriv =
           (PFNGLGETTEXLEVELPARAMETERIVPROC)(*load)("glGetTexLevelParameteriv");
      glad_glIsEnabled = (PFNGLISENABLEDPROC)(*load)("glIsEnabled");
      glad_glDepthRange = (PFNGLDEPTHRANGEPROC)(*load)("glDepthRange");
      glad_glViewport = (PFNGLVIEWPORTPROC)(*load)("glViewport");
      glad_glNewList = (PFNGLNEWLISTPROC)(*load)("glNewList");
      glad_glEndList = (PFNGLENDLISTPROC)(*load)("glEndList");
      glad_glCallList = (PFNGLCALLLISTPROC)(*load)("glCallList");
      glad_glCallLists = (PFNGLCALLLISTSPROC)(*load)("glCallLists");
      glad_glDeleteLists = (PFNGLDELETELISTSPROC)(*load)("glDeleteLists");
      glad_glGenLists = (PFNGLGENLISTSPROC)(*load)("glGenLists");
      glad_glListBase = (PFNGLLISTBASEPROC)(*load)("glListBase");
      glad_glBegin = (PFNGLBEGINPROC)(*load)("glBegin");
      glad_glBitmap = (PFNGLBITMAPPROC)(*load)("glBitmap");
      glad_glColor3b = (PFNGLCOLOR3BPROC)(*load)("glColor3b");
      glad_glColor3bv = (PFNGLCOLOR3BVPROC)(*load)("glColor3bv");
      glad_glColor3d = (PFNGLCOLOR3DPROC)(*load)("glColor3d");
      glad_glColor3dv = (PFNGLCOLOR3DVPROC)(*load)("glColor3dv");
      glad_glColor3f = (PFNGLCOLOR3FPROC)(*load)("glColor3f");
      glad_glColor3fv = (PFNGLCOLOR3FVPROC)(*load)("glColor3fv");
      glad_glColor3i = (PFNGLCOLOR3IPROC)(*load)("glColor3i");
      glad_glColor3iv = (PFNGLCOLOR3IVPROC)(*load)("glColor3iv");
      glad_glColor3s = (PFNGLCOLOR3SPROC)(*load)("glColor3s");
      glad_glColor3sv = (PFNGLCOLOR3SVPROC)(*load)("glColor3sv");
      glad_glColor3ub = (PFNGLCOLOR3UBPROC)(*load)("glColor3ub");
      glad_glColor3ubv = (PFNGLCOLOR3UBVPROC)(*load)("glColor3ubv");
      glad_glColor3ui = (PFNGLCOLOR3UIPROC)(*load)("glColor3ui");
      glad_glColor3uiv = (PFNGLCOLOR3UIVPROC)(*load)("glColor3uiv");
      glad_glColor3us = (PFNGLCOLOR3USPROC)(*load)("glColor3us");
      glad_glColor3usv = (PFNGLCOLOR3USVPROC)(*load)("glColor3usv");
      glad_glColor4b = (PFNGLCOLOR4BPROC)(*load)("glColor4b");
      glad_glColor4bv = (PFNGLCOLOR4BVPROC)(*load)("glColor4bv");
      glad_glColor4d = (PFNGLCOLOR4DPROC)(*load)("glColor4d");
      glad_glColor4dv = (PFNGLCOLOR4DVPROC)(*load)("glColor4dv");
      glad_glColor4f = (PFNGLCOLOR4FPROC)(*load)("glColor4f");
      glad_glColor4fv = (PFNGLCOLOR4FVPROC)(*load)("glColor4fv");
      glad_glColor4i = (PFNGLCOLOR4IPROC)(*load)("glColor4i");
      glad_glColor4iv = (PFNGLCOLOR4IVPROC)(*load)("glColor4iv");
      glad_glColor4s = (PFNGLCOLOR4SPROC)(*load)("glColor4s");
      glad_glColor4sv = (PFNGLCOLOR4SVPROC)(*load)("glColor4sv");
      glad_glColor4ub = (PFNGLCOLOR4UBPROC)(*load)("glColor4ub");
      glad_glColor4ubv = (PFNGLCOLOR4UBVPROC)(*load)("glColor4ubv");
      glad_glColor4ui = (PFNGLCOLOR4UIPROC)(*load)("glColor4ui");
      glad_glColor4uiv = (PFNGLCOLOR4UIVPROC)(*load)("glColor4uiv");
      glad_glColor4us = (PFNGLCOLOR4USPROC)(*load)("glColor4us");
      glad_glColor4usv = (PFNGLCOLOR4USVPROC)(*load)("glColor4usv");
      glad_glEdgeFlag = (PFNGLEDGEFLAGPROC)(*load)("glEdgeFlag");
      glad_glEdgeFlagv = (PFNGLEDGEFLAGVPROC)(*load)("glEdgeFlagv");
      glad_glEnd = (PFNGLENDPROC)(*load)("glEnd");
      glad_glIndexd = (PFNGLINDEXDPROC)(*load)("glIndexd");
      glad_glIndexdv = (PFNGLINDEXDVPROC)(*load)("glIndexdv");
      glad_glIndexf = (PFNGLINDEXFPROC)(*load)("glIndexf");
      glad_glIndexfv = (PFNGLINDEXFVPROC)(*load)("glIndexfv");
      glad_glIndexi = (PFNGLINDEXIPROC)(*load)("glIndexi");
      glad_glIndexiv = (PFNGLINDEXIVPROC)(*load)("glIndexiv");
      glad_glIndexs = (PFNGLINDEXSPROC)(*load)("glIndexs");
      glad_glIndexsv = (PFNGLINDEXSVPROC)(*load)("glIndexsv");
      glad_glNormal3b = (PFNGLNORMAL3BPROC)(*load)("glNormal3b");
      glad_glNormal3bv = (PFNGLNORMAL3BVPROC)(*load)("glNormal3bv");
      glad_glNormal3d = (PFNGLNORMAL3DPROC)(*load)("glNormal3d");
      glad_glNormal3dv = (PFNGLNORMAL3DVPROC)(*load)("glNormal3dv");
      glad_glNormal3f = (PFNGLNORMAL3FPROC)(*load)("glNormal3f");
      glad_glNormal3fv = (PFNGLNORMAL3FVPROC)(*load)("glNormal3fv");
      glad_glNormal3i = (PFNGLNORMAL3IPROC)(*load)("glNormal3i");
      glad_glNormal3iv = (PFNGLNORMAL3IVPROC)(*load)("glNormal3iv");
      glad_glNormal3s = (PFNGLNORMAL3SPROC)(*load)("glNormal3s");
      glad_glNormal3sv = (PFNGLNORMAL3SVPROC)(*load)("glNormal3sv");
      glad_glRasterPos2d = (PFNGLRASTERPOS2DPROC)(*load)("glRasterPos2d");
      glad_glRasterPos2dv = (PFNGLRASTERPOS2DVPROC)(*load)("glRasterPos2dv");
      glad_glRasterPos2f = (PFNGLRASTERPOS2FPROC)(*load)("glRasterPos2f");
      glad_glRasterPos2fv = (PFNGLRASTERPOS2FVPROC)(*load)("glRasterPos2fv");
      glad_glRasterPos2i = (PFNGLRASTERPOS2IPROC)(*load)("glRasterPos2i");
      glad_glRasterPos2iv = (PFNGLRASTERPOS2IVPROC)(*load)("glRasterPos2iv");
      glad_glRasterPos2s = (PFNGLRASTERPOS2SPROC)(*load)("glRasterPos2s");
      glad_glRasterPos2sv = (PFNGLRASTERPOS2SVPROC)(*load)("glRasterPos2sv");
      glad_glRasterPos3d = (PFNGLRASTERPOS3DPROC)(*load)("glRasterPos3d");
      glad_glRasterPos3dv = (PFNGLRASTERPOS3DVPROC)(*load)("glRasterPos3dv");
      glad_glRasterPos3f = (PFNGLRASTERPOS3FPROC)(*load)("glRasterPos3f");
      glad_glRasterPos3fv = (PFNGLRASTERPOS3FVPROC)(*load)("glRasterPos3fv");
      glad_glRasterPos3i = (PFNGLRASTERPOS3IPROC)(*load)("glRasterPos3i");
      glad_glRasterPos3iv = (PFNGLRASTERPOS3IVPROC)(*load)("glRasterPos3iv");
      glad_glRasterPos3s = (PFNGLRASTERPOS3SPROC)(*load)("glRasterPos3s");
      glad_glRasterPos3sv = (PFNGLRASTERPOS3SVPROC)(*load)("glRasterPos3sv");
      glad_glRasterPos4d = (PFNGLRASTERPOS4DPROC)(*load)("glRasterPos4d");
      glad_glRasterPos4dv = (PFNGLRASTERPOS4DVPROC)(*load)("glRasterPos4dv");
      glad_glRasterPos4f = (PFNGLRASTERPOS4FPROC)(*load)("glRasterPos4f");
      glad_glRasterPos4fv = (PFNGLRASTERPOS4FVPROC)(*load)("glRasterPos4fv");
      glad_glRasterPos4i = (PFNGLRASTERPOS4IPROC)(*load)("glRasterPos4i");
      glad_glRasterPos4iv = (PFNGLRASTERPOS4IVPROC)(*load)("glRasterPos4iv");
      glad_glRasterPos4s = (PFNGLRASTERPOS4SPROC)(*load)("glRasterPos4s");
      glad_glRasterPos4sv = (PFNGLRASTERPOS4SVPROC)(*load)("glRasterPos4sv");
      glad_glRectd = (PFNGLRECTDPROC)(*load)("glRectd");
      glad_glRectdv = (PFNGLRECTDVPROC)(*load)("glRectdv");
      glad_glRectf = (PFNGLRECTFPROC)(*load)("glRectf");
      glad_glRectfv = (PFNGLRECTFVPROC)(*load)("glRectfv");
      glad_glRecti = (PFNGLRECTIPROC)(*load)("glRecti");
      glad_glRectiv = (PFNGLRECTIVPROC)(*load)("glRectiv");
      glad_glRects = (PFNGLRECTSPROC)(*load)("glRects");
      glad_glRectsv = (PFNGLRECTSVPROC)(*load)("glRectsv");
      glad_glTexCoord1d = (PFNGLTEXCOORD1DPROC)(*load)("glTexCoord1d");
      glad_glTexCoord1dv = (PFNGLTEXCOORD1DVPROC)(*load)("glTexCoord1dv");
      glad_glTexCoord1f = (PFNGLTEXCOORD1FPROC)(*load)("glTexCoord1f");
      glad_glTexCoord1fv = (PFNGLTEXCOORD1FVPROC)(*load)("glTexCoord1fv");
      glad_glTexCoord1i = (PFNGLTEXCOORD1IPROC)(*load)("glTexCoord1i");
      glad_glTexCoord1iv = (PFNGLTEXCOORD1IVPROC)(*load)("glTexCoord1iv");
      glad_glTexCoord1s = (PFNGLTEXCOORD1SPROC)(*load)("glTexCoord1s");
      glad_glTexCoord1sv = (PFNGLTEXCOORD1SVPROC)(*load)("glTexCoord1sv");
      glad_glTexCoord2d = (PFNGLTEXCOORD2DPROC)(*load)("glTexCoord2d");
      glad_glTexCoord2dv = (PFNGLTEXCOORD2DVPROC)(*load)("glTexCoord2dv");
      glad_glTexCoord2f = (PFNGLTEXCOORD2FPROC)(*load)("glTexCoord2f");
      glad_glTexCoord2fv = (PFNGLTEXCOORD2FVPROC)(*load)("glTexCoord2fv");
      glad_glTexCoord2i = (PFNGLTEXCOORD2IPROC)(*load)("glTexCoord2i");
      glad_glTexCoord2iv = (PFNGLTEXCOORD2IVPROC)(*load)("glTexCoord2iv");
      glad_glTexCoord2s = (PFNGLTEXCOORD2SPROC)(*load)("glTexCoord2s");
      glad_glTexCoord2sv = (PFNGLTEXCOORD2SVPROC)(*load)("glTexCoord2sv");
      glad_glTexCoord3d = (PFNGLTEXCOORD3DPROC)(*load)("glTexCoord3d");
      glad_glTexCoord3dv = (PFNGLTEXCOORD3DVPROC)(*load)("glTexCoord3dv");
      glad_glTexCoord3f = (PFNGLTEXCOORD3FPROC)(*load)("glTexCoord3f");
      glad_glTexCoord3fv = (PFNGLTEXCOORD3FVPROC)(*load)("glTexCoord3fv");
      glad_glTexCoord3i = (PFNGLTEXCOORD3IPROC)(*load)("glTexCoord3i");
      glad_glTexCoord3iv = (PFNGLTEXCOORD3IVPROC)(*load)("glTexCoord3iv");
      glad_glTexCoord3s = (PFNGLTEXCOORD3SPROC)(*load)("glTexCoord3s");
      glad_glTexCoord3sv = (PFNGLTEXCOORD3SVPROC)(*load)("glTexCoord3sv");
      glad_glTexCoord4d = (PFNGLTEXCOORD4DPROC)(*load)("glTexCoord4d");
      glad_glTexCoord4dv = (PFNGLTEXCOORD4DVPROC)(*load)("glTexCoord4dv");
      glad_glTexCoord4f = (PFNGLTEXCOORD4FPROC)(*load)("glTexCoord4f");
      glad_glTexCoord4fv = (PFNGLTEXCOORD4FVPROC)(*load)("glTexCoord4fv");
      glad_glTexCoord4i = (PFNGLTEXCOORD4IPROC)(*load)("glTexCoord4i");
      glad_glTexCoord4iv = (PFNGLTEXCOORD4IVPROC)(*load)("glTexCoord4iv");
      glad_glTexCoord4s = (PFNGLTEXCOORD4SPROC)(*load)("glTexCoord4s");
      glad_glTexCoord4sv = (PFNGLTEXCOORD4SVPROC)(*load)("glTexCoord4sv");
      glad_glVertex2d = (PFNGLVERTEX2DPROC)(*load)("glVertex2d");
      glad_glVertex2dv = (PFNGLVERTEX2DVPROC)(*load)("glVertex2dv");
      glad_glVertex2f = (PFNGLVERTEX2FPROC)(*load)("glVertex2f");
      glad_glVertex2fv = (PFNGLVERTEX2FVPROC)(*load)("glVertex2fv");
      glad_glVertex2i = (PFNGLVERTEX2IPROC)(*load)("glVertex2i");
      glad_glVertex2iv = (PFNGLVERTEX2IVPROC)(*load)("glVertex2iv");
      glad_glVertex2s = (PFNGLVERTEX2SPROC)(*load)("glVertex2s");
      glad_glVertex2sv = (PFNGLVERTEX2SVPROC)(*load)("glVertex2sv");
      glad_glVertex3d = (PFNGLVERTEX3DPROC)(*load)("glVertex3d");
      glad_glVertex3dv = (PFNGLVERTEX3DVPROC)(*load)("glVertex3dv");
      glad_glVertex3f = (PFNGLVERTEX3FPROC)(*load)("glVertex3f");
      glad_glVertex3fv = (PFNGLVERTEX3FVPROC)(*load)("glVertex3fv");
      glad_glVertex3i = (PFNGLVERTEX3IPROC)(*load)("glVertex3i");
      glad_glVertex3iv = (PFNGLVERTEX3IVPROC)(*load)("glVertex3iv");
      glad_glVertex3s = (PFNGLVERTEX3SPROC)(*load)("glVertex3s");
      glad_glVertex3sv = (PFNGLVERTEX3SVPROC)(*load)("glVertex3sv");
      glad_glVertex4d = (PFNGLVERTEX4DPROC)(*load)("glVertex4d");
      glad_glVertex4dv = (PFNGLVERTEX4DVPROC)(*load)("glVertex4dv");
      glad_glVertex4f = (PFNGLVERTEX4FPROC)(*load)("glVertex4f");
      glad_glVertex4fv = (PFNGLVERTEX4FVPROC)(*load)("glVertex4fv");
      glad_glVertex4i = (PFNGLVERTEX4IPROC)(*load)("glVertex4i");
      glad_glVertex4iv = (PFNGLVERTEX4IVPROC)(*load)("glVertex4iv");
      glad_glVertex4s = (PFNGLVERTEX4SPROC)(*load)("glVertex4s");
      glad_glVertex4sv = (PFNGLVERTEX4SVPROC)(*load)("glVertex4sv");
      glad_glClipPlane = (PFNGLCLIPPLANEPROC)(*load)("glClipPlane");
      glad_glColorMaterial = (PFNGLCOLORMATERIALPROC)(*load)("glColorMaterial");
      glad_glFogf = (PFNGLFOGFPROC)(*load)("glFogf");
      glad_glFogfv = (PFNGLFOGFVPROC)(*load)("glFogfv");
      glad_glFogi = (PFNGLFOGIPROC)(*load)("glFogi");
      glad_glFogiv = (PFNGLFOGIVPROC)(*load)("glFogiv");
      glad_glLightf = (PFNGLLIGHTFPROC)(*load)("glLightf");
      glad_glLightfv = (PFNGLLIGHTFVPROC)(*load)("glLightfv");
      glad_glLighti = (PFNGLLIGHTIPROC)(*load)("glLighti");
      glad_glLightiv = (PFNGLLIGHTIVPROC)(*load)("glLightiv");
      glad_glLightModelf = (PFNGLLIGHTMODELFPROC)(*load)("glLightModelf");
      glad_glLightModelfv = (PFNGLLIGHTMODELFVPROC)(*load)("glLightModelfv");
      glad_glLightModeli = (PFNGLLIGHTMODELIPROC)(*load)("glLightModeli");
      glad_glLightModeliv = (PFNGLLIGHTMODELIVPROC)(*load)("glLightModeliv");
      glad_glLineStipple = (PFNGLLINESTIPPLEPROC)(*load)("glLineStipple");
      glad_glMaterialf = (PFNGLMATERIALFPROC)(*load)("glMaterialf");
      glad_glMaterialfv = (PFNGLMATERIALFVPROC)(*load)("glMaterialfv");
      glad_glMateriali = (PFNGLMATERIALIPROC)(*load)("glMateriali");
      glad_glMaterialiv = (PFNGLMATERIALIVPROC)(*load)("glMaterialiv");
      glad_glPolygonStipple = (PFNGLPOLYGONSTIPPLEPROC)(*load)("glPolygonStipple");
      glad_glShadeModel = (PFNGLSHADEMODELPROC)(*load)("glShadeModel");
      glad_glTexEnvf = (PFNGLTEXENVFPROC)(*load)("glTexEnvf");
      glad_glTexEnvfv = (PFNGLTEXENVFVPROC)(*load)("glTexEnvfv");
      glad_glTexEnvi = (PFNGLTEXENVIPROC)(*load)("glTexEnvi");
      glad_glTexEnviv = (PFNGLTEXENVIVPROC)(*load)("glTexEnviv");
      glad_glTexGend = (PFNGLTEXGENDPROC)(*load)("glTexGend");
      glad_glTexGendv = (PFNGLTEXGENDVPROC)(*load)("glTexGendv");
      glad_glTexGenf = (PFNGLTEXGENFPROC)(*load)("glTexGenf");
      glad_glTexGenfv = (PFNGLTEXGENFVPROC)(*load)("glTexGenfv");
      glad_glTexGeni = (PFNGLTEXGENIPROC)(*load)("glTexGeni");
      glad_glTexGeniv = (PFNGLTEXGENIVPROC)(*load)("glTexGeniv");
      glad_glFeedbackBuffer = (PFNGLFEEDBACKBUFFERPROC)(*load)("glFeedbackBuffer");
      glad_glSelectBuffer = (PFNGLSELECTBUFFERPROC)(*load)("glSelectBuffer");
      glad_glRenderMode = (PFNGLRENDERMODEPROC)(*load)("glRenderMode");
      glad_glInitNames = (PFNGLINITNAMESPROC)(*load)("glInitNames");
      glad_glLoadName = (PFNGLLOADNAMEPROC)(*load)("glLoadName");
      glad_glPassThrough = (PFNGLPASSTHROUGHPROC)(*load)("glPassThrough");
      glad_glPopName = (PFNGLPOPNAMEPROC)(*load)("glPopName");
      glad_glPushName = (PFNGLPUSHNAMEPROC)(*load)("glPushName");
      glad_glClearAccum = (PFNGLCLEARACCUMPROC)(*load)("glClearAccum");
      glad_glClearIndex = (PFNGLCLEARINDEXPROC)(*load)("glClearIndex");
      glad_glIndexMask = (PFNGLINDEXMASKPROC)(*load)("glIndexMask");
      glad_glAccum = (PFNGLACCUMPROC)(*load)("glAccum");
      glad_glPopAttrib = (PFNGLPOPATTRIBPROC)(*load)("glPopAttrib");
      glad_glPushAttrib = (PFNGLPUSHATTRIBPROC)(*load)("glPushAttrib");
      glad_glMap1d = (PFNGLMAP1DPROC)(*load)("glMap1d");
      glad_glMap1f = (PFNGLMAP1FPROC)(*load)("glMap1f");
      glad_glMap2d = (PFNGLMAP2DPROC)(*load)("glMap2d");
      glad_glMap2f = (PFNGLMAP2FPROC)(*load)("glMap2f");
      glad_glMapGrid1d = (PFNGLMAPGRID1DPROC)(*load)("glMapGrid1d");
      glad_glMapGrid1f = (PFNGLMAPGRID1FPROC)(*load)("glMapGrid1f");
      glad_glMapGrid2d = (PFNGLMAPGRID2DPROC)(*load)("glMapGrid2d");
      glad_glMapGrid2f = (PFNGLMAPGRID2FPROC)(*load)("glMapGrid2f");
      glad_glEvalCoord1d = (PFNGLEVALCOORD1DPROC)(*load)("glEvalCoord1d");
      glad_glEvalCoord1dv = (PFNGLEVALCOORD1DVPROC)(*load)("glEvalCoord1dv");
      glad_glEvalCoord1f = (PFNGLEVALCOORD1FPROC)(*load)("glEvalCoord1f");
      glad_glEvalCoord1fv = (PFNGLEVALCOORD1FVPROC)(*load)("glEvalCoord1fv");
      glad_glEvalCoord2d = (PFNGLEVALCOORD2DPROC)(*load)("glEvalCoord2d");
      glad_glEvalCoord2dv = (PFNGLEVALCOORD2DVPROC)(*load)("glEvalCoord2dv");
      glad_glEvalCoord2f = (PFNGLEVALCOORD2FPROC)(*load)("glEvalCoord2f");
      glad_glEvalCoord2fv = (PFNGLEVALCOORD2FVPROC)(*load)("glEvalCoord2fv");
      glad_glEvalMesh1 = (PFNGLEVALMESH1PROC)(*load)("glEvalMesh1");
      glad_glEvalPoint1 = (PFNGLEVALPOINT1PROC)(*load)("glEvalPoint1");
      glad_glEvalMesh2 = (PFNGLEVALMESH2PROC)(*load)("glEvalMesh2");
      glad_glEvalPoint2 = (PFNGLEVALPOINT2PROC)(*load)("glEvalPoint2");
      glad_glAlphaFunc = (PFNGLALPHAFUNCPROC)(*load)("glAlphaFunc");
      glad_glPixelZoom = (PFNGLPIXELZOOMPROC)(*load)("glPixelZoom");
      glad_glPixelTransferf = (PFNGLPIXELTRANSFERFPROC)(*load)("glPixelTransferf");
      glad_glPixelTransferi = (PFNGLPIXELTRANSFERIPROC)(*load)("glPixelTransferi");
      glad_glPixelMapfv = (PFNGLPIXELMAPFVPROC)(*load)("glPixelMapfv");
      glad_glPixelMapuiv = (PFNGLPIXELMAPUIVPROC)(*load)("glPixelMapuiv");
      glad_glPixelMapusv = (PFNGLPIXELMAPUSVPROC)(*load)("glPixelMapusv");
      glad_glCopyPixels = (PFNGLCOPYPIXELSPROC)(*load)("glCopyPixels");
      glad_glDrawPixels = (PFNGLDRAWPIXELSPROC)(*load)("glDrawPixels");
      glad_glGetClipPlane = (PFNGLGETCLIPPLANEPROC)(*load)("glGetClipPlane");
      glad_glGetLightfv = (PFNGLGETLIGHTFVPROC)(*load)("glGetLightfv");
      glad_glGetLightiv = (PFNGLGETLIGHTIVPROC)(*load)("glGetLightiv");
      glad_glGetMapdv = (PFNGLGETMAPDVPROC)(*load)("glGetMapdv");
      glad_glGetMapfv = (PFNGLGETMAPFVPROC)(*load)("glGetMapfv");
      glad_glGetMapiv = (PFNGLGETMAPIVPROC)(*load)("glGetMapiv");
      glad_glGetMaterialfv = (PFNGLGETMATERIALFVPROC)(*load)("glGetMaterialfv");
      glad_glGetMaterialiv = (PFNGLGETMATERIALIVPROC)(*load)("glGetMaterialiv");
      glad_glGetPixelMapfv = (PFNGLGETPIXELMAPFVPROC)(*load)("glGetPixelMapfv");
      glad_glGetPixelMapuiv = (PFNGLGETPIXELMAPUIVPROC)(*load)("glGetPixelMapuiv");
      glad_glGetPixelMapusv = (PFNGLGETPIXELMAPUSVPROC)(*load)("glGetPixelMapusv");
      glad_glGetPolygonStipple = (PFNGLGETPOLYGONSTIPPLEPROC)(*load)("glGetPolygonStipple");
      glad_glGetTexEnvfv = (PFNGLGETTEXENVFVPROC)(*load)("glGetTexEnvfv");
      glad_glGetTexEnviv = (PFNGLGETTEXENVIVPROC)(*load)("glGetTexEnviv");
      glad_glGetTexGendv = (PFNGLGETTEXGENDVPROC)(*load)("glGetTexGendv");
      glad_glGetTexGenfv = (PFNGLGETTEXGENFVPROC)(*load)("glGetTexGenfv");
      glad_glGetTexGeniv = (PFNGLGETTEXGENIVPROC)(*load)("glGetTexGeniv");
      glad_glIsList = (PFNGLISLISTPROC)(*load)("glIsList");
      glad_glFrustum = (PFNGLFRUSTUMPROC)(*load)("glFrustum");
      glad_glLoadIdentity = (PFNGLLOADIDENTITYPROC)(*load)("glLoadIdentity");
      glad_glLoadMatrixf = (PFNGLLOADMATRIXFPROC)(*load)("glLoadMatrixf");
      glad_glLoadMatrixd = (PFNGLLOADMATRIXDPROC)(*load)("glLoadMatrixd");
      glad_glMatrixMode = (PFNGLMATRIXMODEPROC)(*load)("glMatrixMode");
      glad_glMultMatrixf = (PFNGLMULTMATRIXFPROC)(*load)("glMultMatrixf");
      glad_glMultMatrixd = (PFNGLMULTMATRIXDPROC)(*load)("glMultMatrixd");
      glad_glOrtho = (PFNGLORTHOPROC)(*load)("glOrtho");
      glad_glPopMatrix = (PFNGLPOPMATRIXPROC)(*load)("glPopMatrix");
      glad_glPushMatrix = (PFNGLPUSHMATRIXPROC)(*load)("glPushMatrix");
      glad_glRotated = (PFNGLROTATEDPROC)(*load)("glRotated");
      glad_glRotatef = (PFNGLROTATEFPROC)(*load)("glRotatef");
      glad_glScaled = (PFNGLSCALEDPROC)(*load)("glScaled");
      glad_glScalef = (PFNGLSCALEFPROC)(*load)("glScalef");
      glad_glTranslated = (PFNGLTRANSLATEDPROC)(*load)("glTranslated");
      glad_glTranslatef = (PFNGLTRANSLATEFPROC)(*load)("glTranslatef");
    }
    if (GLAD_GL_VERSION_1_1 != 0) {
      glad_glDrawArrays = (PFNGLDRAWARRAYSPROC)(*load)("glDrawArrays");
      glad_glDrawElements = (PFNGLDRAWELEMENTSPROC)(*load)("glDrawElements");
      glad_glGetPointerv = (PFNGLGETPOINTERVPROC)(*load)("glGetPointerv");
      glad_glPolygonOffset = (PFNGLPOLYGONOFFSETPROC)(*load)("glPolygonOffset");
      glad_glCopyTexImage1D = (PFNGLCOPYTEXIMAGE1DPROC)(*load)("glCopyTexImage1D");
      glad_glCopyTexImage2D = (PFNGLCOPYTEXIMAGE2DPROC)(*load)("glCopyTexImage2D");
      glad_glCopyTexSubImage1D = (PFNGLCOPYTEXSUBIMAGE1DPROC)(*load)("glCopyTexSubImage1D");
      glad_glCopyTexSubImage2D = (PFNGLCOPYTEXSUBIMAGE2DPROC)(*load)("glCopyTexSubImage2D");
      glad_glTexSubImage1D = (PFNGLTEXSUBIMAGE1DPROC)(*load)("glTexSubImage1D");
      glad_glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC)(*load)("glTexSubImage2D");
      glad_glBindTexture = (PFNGLBINDTEXTUREPROC)(*load)("glBindTexture");
      glad_glDeleteTextures = (PFNGLDELETETEXTURESPROC)(*load)("glDeleteTextures");
      glad_glGenTextures = (PFNGLGENTEXTURESPROC)(*load)("glGenTextures");
      glad_glIsTexture = (PFNGLISTEXTUREPROC)(*load)("glIsTexture");
      glad_glArrayElement = (PFNGLARRAYELEMENTPROC)(*load)("glArrayElement");
      glad_glColorPointer = (PFNGLCOLORPOINTERPROC)(*load)("glColorPointer");
      glad_glDisableClientState = (PFNGLDISABLECLIENTSTATEPROC)(*load)("glDisableClientState");
      glad_glEdgeFlagPointer = (PFNGLEDGEFLAGPOINTERPROC)(*load)("glEdgeFlagPointer");
      glad_glEnableClientState = (PFNGLENABLECLIENTSTATEPROC)(*load)("glEnableClientState");
      glad_glIndexPointer = (PFNGLINDEXPOINTERPROC)(*load)("glIndexPointer");
      glad_glInterleavedArrays = (PFNGLINTERLEAVEDARRAYSPROC)(*load)("glInterleavedArrays");
      glad_glNormalPointer = (PFNGLNORMALPOINTERPROC)(*load)("glNormalPointer");
      glad_glTexCoordPointer = (PFNGLTEXCOORDPOINTERPROC)(*load)("glTexCoordPointer");
      glad_glVertexPointer = (PFNGLVERTEXPOINTERPROC)(*load)("glVertexPointer");
      glad_glAreTexturesResident = (PFNGLARETEXTURESRESIDENTPROC)(*load)("glAreTexturesResident");
      glad_glPrioritizeTextures = (PFNGLPRIORITIZETEXTURESPROC)(*load)("glPrioritizeTextures");
      glad_glIndexub = (PFNGLINDEXUBPROC)(*load)("glIndexub");
      glad_glIndexubv = (PFNGLINDEXUBVPROC)(*load)("glIndexubv");
      glad_glPopClientAttrib = (PFNGLPOPCLIENTATTRIBPROC)(*load)("glPopClientAttrib");
      glad_glPushClientAttrib = (PFNGLPUSHCLIENTATTRIBPROC)(*load)("glPushClientAttrib");
    }
    if (GLAD_GL_VERSION_1_2 != 0) {
      glad_glDrawRangeElements = (PFNGLDRAWRANGEELEMENTSPROC)(*load)("glDrawRangeElements");
      glad_glTexImage3D = (PFNGLTEXIMAGE3DPROC)(*load)("glTexImage3D");
      glad_glTexSubImage3D = (PFNGLTEXSUBIMAGE3DPROC)(*load)("glTexSubImage3D");
      glad_glCopyTexSubImage3D = (PFNGLCOPYTEXSUBIMAGE3DPROC)(*load)("glCopyTexSubImage3D");
    }
    if (GLAD_GL_VERSION_1_3 != 0) {
      glad_glActiveTexture = (PFNGLACTIVETEXTUREPROC)(*load)("glActiveTexture");
      glad_glSampleCoverage = (PFNGLSAMPLECOVERAGEPROC)(*load)("glSampleCoverage");
      glad_glCompressedTexImage3D = (PFNGLCOMPRESSEDTEXIMAGE3DPROC)(*load)("glCompressedTexImage3D")
      ;
      glad_glCompressedTexImage2D = (PFNGLCOMPRESSEDTEXIMAGE2DPROC)(*load)("glCompressedTexImage2D")
      ;
      glad_glCompressedTexImage1D = (PFNGLCOMPRESSEDTEXIMAGE1DPROC)(*load)("glCompressedTexImage1D")
      ;
      glad_glCompressedTexSubImage3D =
           (PFNGLCOMPRESSEDTEXSUBIMAGE3DPROC)(*load)("glCompressedTexSubImage3D");
      glad_glCompressedTexSubImage2D =
           (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)(*load)("glCompressedTexSubImage2D");
      glad_glCompressedTexSubImage1D =
           (PFNGLCOMPRESSEDTEXSUBIMAGE1DPROC)(*load)("glCompressedTexSubImage1D");
      glad_glGetCompressedTexImage =
           (PFNGLGETCOMPRESSEDTEXIMAGEPROC)(*load)("glGetCompressedTexImage");
      glad_glClientActiveTexture = (PFNGLCLIENTACTIVETEXTUREPROC)(*load)("glClientActiveTexture");
      glad_glMultiTexCoord1d = (PFNGLMULTITEXCOORD1DPROC)(*load)("glMultiTexCoord1d");
      glad_glMultiTexCoord1dv = (PFNGLMULTITEXCOORD1DVPROC)(*load)("glMultiTexCoord1dv");
      glad_glMultiTexCoord1f = (PFNGLMULTITEXCOORD1FPROC)(*load)("glMultiTexCoord1f");
      glad_glMultiTexCoord1fv = (PFNGLMULTITEXCOORD1FVPROC)(*load)("glMultiTexCoord1fv");
      glad_glMultiTexCoord1i = (PFNGLMULTITEXCOORD1IPROC)(*load)("glMultiTexCoord1i");
      glad_glMultiTexCoord1iv = (PFNGLMULTITEXCOORD1IVPROC)(*load)("glMultiTexCoord1iv");
      glad_glMultiTexCoord1s = (PFNGLMULTITEXCOORD1SPROC)(*load)("glMultiTexCoord1s");
      glad_glMultiTexCoord1sv = (PFNGLMULTITEXCOORD1SVPROC)(*load)("glMultiTexCoord1sv");
      glad_glMultiTexCoord2d = (PFNGLMULTITEXCOORD2DPROC)(*load)("glMultiTexCoord2d");
      glad_glMultiTexCoord2dv = (PFNGLMULTITEXCOORD2DVPROC)(*load)("glMultiTexCoord2dv");
      glad_glMultiTexCoord2f = (PFNGLMULTITEXCOORD2FPROC)(*load)("glMultiTexCoord2f");
      glad_glMultiTexCoord2fv = (PFNGLMULTITEXCOORD2FVPROC)(*load)("glMultiTexCoord2fv");
      glad_glMultiTexCoord2i = (PFNGLMULTITEXCOORD2IPROC)(*load)("glMultiTexCoord2i");
      glad_glMultiTexCoord2iv = (PFNGLMULTITEXCOORD2IVPROC)(*load)("glMultiTexCoord2iv");
      glad_glMultiTexCoord2s = (PFNGLMULTITEXCOORD2SPROC)(*load)("glMultiTexCoord2s");
      glad_glMultiTexCoord2sv = (PFNGLMULTITEXCOORD2SVPROC)(*load)("glMultiTexCoord2sv");
      glad_glMultiTexCoord3d = (PFNGLMULTITEXCOORD3DPROC)(*load)("glMultiTexCoord3d");
      glad_glMultiTexCoord3dv = (PFNGLMULTITEXCOORD3DVPROC)(*load)("glMultiTexCoord3dv");
      glad_glMultiTexCoord3f = (PFNGLMULTITEXCOORD3FPROC)(*load)("glMultiTexCoord3f");
      glad_glMultiTexCoord3fv = (PFNGLMULTITEXCOORD3FVPROC)(*load)("glMultiTexCoord3fv");
      glad_glMultiTexCoord3i = (PFNGLMULTITEXCOORD3IPROC)(*load)("glMultiTexCoord3i");
      glad_glMultiTexCoord3iv = (PFNGLMULTITEXCOORD3IVPROC)(*load)("glMultiTexCoord3iv");
      glad_glMultiTexCoord3s = (PFNGLMULTITEXCOORD3SPROC)(*load)("glMultiTexCoord3s");
      glad_glMultiTexCoord3sv = (PFNGLMULTITEXCOORD3SVPROC)(*load)("glMultiTexCoord3sv");
      glad_glMultiTexCoord4d = (PFNGLMULTITEXCOORD4DPROC)(*load)("glMultiTexCoord4d");
      glad_glMultiTexCoord4dv = (PFNGLMULTITEXCOORD4DVPROC)(*load)("glMultiTexCoord4dv");
      glad_glMultiTexCoord4f = (PFNGLMULTITEXCOORD4FPROC)(*load)("glMultiTexCoord4f");
      glad_glMultiTexCoord4fv = (PFNGLMULTITEXCOORD4FVPROC)(*load)("glMultiTexCoord4fv");
      glad_glMultiTexCoord4i = (PFNGLMULTITEXCOORD4IPROC)(*load)("glMultiTexCoord4i");
      glad_glMultiTexCoord4iv = (PFNGLMULTITEXCOORD4IVPROC)(*load)("glMultiTexCoord4iv");
      glad_glMultiTexCoord4s = (PFNGLMULTITEXCOORD4SPROC)(*load)("glMultiTexCoord4s");
      glad_glMultiTexCoord4sv = (PFNGLMULTITEXCOORD4SVPROC)(*load)("glMultiTexCoord4sv");
      glad_glLoadTransposeMatrixf = (PFNGLLOADTRANSPOSEMATRIXFPROC)(*load)("glLoadTransposeMatrixf")
      ;
      glad_glLoadTransposeMatrixd = (PFNGLLOADTRANSPOSEMATRIXDPROC)(*load)("glLoadTransposeMatrixd")
      ;
      glad_glMultTransposeMatrixf = (PFNGLMULTTRANSPOSEMATRIXFPROC)(*load)("glMultTransposeMatrixf")
      ;
      glad_glMultTransposeMatrixd = (PFNGLMULTTRANSPOSEMATRIXDPROC)(*load)("glMultTransposeMatrixd")
      ;
    }
    if (GLAD_GL_VERSION_1_4 != 0) {
      glad_glBlendFuncSeparate = (PFNGLBLENDFUNCSEPARATEPROC)(*load)("glBlendFuncSeparate");
      glad_glMultiDrawArrays = (PFNGLMULTIDRAWARRAYSPROC)(*load)("glMultiDrawArrays");
      glad_glMultiDrawElements = (PFNGLMULTIDRAWELEMENTSPROC)(*load)("glMultiDrawElements");
      glad_glPointParameterf = (PFNGLPOINTPARAMETERFPROC)(*load)("glPointParameterf");
      glad_glPointParameterfv = (PFNGLPOINTPARAMETERFVPROC)(*load)("glPointParameterfv");
      glad_glPointParameteri = (PFNGLPOINTPARAMETERIPROC)(*load)("glPointParameteri");
      glad_glPointParameteriv = (PFNGLPOINTPARAMETERIVPROC)(*load)("glPointParameteriv");
      glad_glFogCoordf = (PFNGLFOGCOORDFPROC)(*load)("glFogCoordf");
      glad_glFogCoordfv = (PFNGLFOGCOORDFVPROC)(*load)("glFogCoordfv");
      glad_glFogCoordd = (PFNGLFOGCOORDDPROC)(*load)("glFogCoordd");
      glad_glFogCoorddv = (PFNGLFOGCOORDDVPROC)(*load)("glFogCoorddv");
      glad_glFogCoordPointer = (PFNGLFOGCOORDPOINTERPROC)(*load)("glFogCoordPointer");
      glad_glSecondaryColor3b = (PFNGLSECONDARYCOLOR3BPROC)(*load)("glSecondaryColor3b");
      glad_glSecondaryColor3bv = (PFNGLSECONDARYCOLOR3BVPROC)(*load)("glSecondaryColor3bv");
      glad_glSecondaryColor3d = (PFNGLSECONDARYCOLOR3DPROC)(*load)("glSecondaryColor3d");
      glad_glSecondaryColor3dv = (PFNGLSECONDARYCOLOR3DVPROC)(*load)("glSecondaryColor3dv");
      glad_glSecondaryColor3f = (PFNGLSECONDARYCOLOR3FPROC)(*load)("glSecondaryColor3f");
      glad_glSecondaryColor3fv = (PFNGLSECONDARYCOLOR3FVPROC)(*load)("glSecondaryColor3fv");
      glad_glSecondaryColor3i = (PFNGLSECONDARYCOLOR3IPROC)(*load)("glSecondaryColor3i");
      glad_glSecondaryColor3iv = (PFNGLSECONDARYCOLOR3IVPROC)(*load)("glSecondaryColor3iv");
      glad_glSecondaryColor3s = (PFNGLSECONDARYCOLOR3SPROC)(*load)("glSecondaryColor3s");
      glad_glSecondaryColor3sv = (PFNGLSECONDARYCOLOR3SVPROC)(*load)("glSecondaryColor3sv");
      glad_glSecondaryColor3ub = (PFNGLSECONDARYCOLOR3UBPROC)(*load)("glSecondaryColor3ub");
      glad_glSecondaryColor3ubv = (PFNGLSECONDARYCOLOR3UBVPROC)(*load)("glSecondaryColor3ubv");
      glad_glSecondaryColor3ui = (PFNGLSECONDARYCOLOR3UIPROC)(*load)("glSecondaryColor3ui");
      glad_glSecondaryColor3uiv = (PFNGLSECONDARYCOLOR3UIVPROC)(*load)("glSecondaryColor3uiv");
      glad_glSecondaryColor3us = (PFNGLSECONDARYCOLOR3USPROC)(*load)("glSecondaryColor3us");
      glad_glSecondaryColor3usv = (PFNGLSECONDARYCOLOR3USVPROC)(*load)("glSecondaryColor3usv");
      glad_glSecondaryColorPointer =
           (PFNGLSECONDARYCOLORPOINTERPROC)(*load)("glSecondaryColorPointer");
      glad_glWindowPos2d = (PFNGLWINDOWPOS2DPROC)(*load)("glWindowPos2d");
      glad_glWindowPos2dv = (PFNGLWINDOWPOS2DVPROC)(*load)("glWindowPos2dv");
      glad_glWindowPos2f = (PFNGLWINDOWPOS2FPROC)(*load)("glWindowPos2f");
      glad_glWindowPos2fv = (PFNGLWINDOWPOS2FVPROC)(*load)("glWindowPos2fv");
      glad_glWindowPos2i = (PFNGLWINDOWPOS2IPROC)(*load)("glWindowPos2i");
      glad_glWindowPos2iv = (PFNGLWINDOWPOS2IVPROC)(*load)("glWindowPos2iv");
      glad_glWindowPos2s = (PFNGLWINDOWPOS2SPROC)(*load)("glWindowPos2s");
      glad_glWindowPos2sv = (PFNGLWINDOWPOS2SVPROC)(*load)("glWindowPos2sv");
      glad_glWindowPos3d = (PFNGLWINDOWPOS3DPROC)(*load)("glWindowPos3d");
      glad_glWindowPos3dv = (PFNGLWINDOWPOS3DVPROC)(*load)("glWindowPos3dv");
      glad_glWindowPos3f = (PFNGLWINDOWPOS3FPROC)(*load)("glWindowPos3f");
      glad_glWindowPos3fv = (PFNGLWINDOWPOS3FVPROC)(*load)("glWindowPos3fv");
      glad_glWindowPos3i = (PFNGLWINDOWPOS3IPROC)(*load)("glWindowPos3i");
      glad_glWindowPos3iv = (PFNGLWINDOWPOS3IVPROC)(*load)("glWindowPos3iv");
      glad_glWindowPos3s = (PFNGLWINDOWPOS3SPROC)(*load)("glWindowPos3s");
      glad_glWindowPos3sv = (PFNGLWINDOWPOS3SVPROC)(*load)("glWindowPos3sv");
      glad_glBlendColor = (PFNGLBLENDCOLORPROC)(*load)("glBlendColor");
      glad_glBlendEquation = (PFNGLBLENDEQUATIONPROC)(*load)("glBlendEquation");
    }
    if (GLAD_GL_VERSION_1_5 != 0) {
      glad_glGenQueries = (PFNGLGENQUERIESPROC)(*load)("glGenQueries");
      glad_glDeleteQueries = (PFNGLDELETEQUERIESPROC)(*load)("glDeleteQueries");
      glad_glIsQuery = (PFNGLISQUERYPROC)(*load)("glIsQuery");
      glad_glBeginQuery = (PFNGLBEGINQUERYPROC)(*load)("glBeginQuery");
      glad_glEndQuery = (PFNGLENDQUERYPROC)(*load)("glEndQuery");
      glad_glGetQueryiv = (PFNGLGETQUERYIVPROC)(*load)("glGetQueryiv");
      glad_glGetQueryObjectiv = (PFNGLGETQUERYOBJECTIVPROC)(*load)("glGetQueryObjectiv");
      glad_glGetQueryObjectuiv = (PFNGLGETQUERYOBJECTUIVPROC)(*load)("glGetQueryObjectuiv");
      glad_glBindBuffer = (PFNGLBINDBUFFERPROC)(*load)("glBindBuffer");
      glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)(*load)("glDeleteBuffers");
      glad_glGenBuffers = (PFNGLGENBUFFERSPROC)(*load)("glGenBuffers");
      glad_glIsBuffer = (PFNGLISBUFFERPROC)(*load)("glIsBuffer");
      glad_glBufferData = (PFNGLBUFFERDATAPROC)(*load)("glBufferData");
      glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC)(*load)("glBufferSubData");
      glad_glGetBufferSubData = (PFNGLGETBUFFERSUBDATAPROC)(*load)("glGetBufferSubData");
      glad_glMapBuffer = (PFNGLMAPBUFFERPROC)(*load)("glMapBuffer");
      glad_glUnmapBuffer = (PFNGLUNMAPBUFFERPROC)(*load)("glUnmapBuffer");
      glad_glGetBufferParameteriv = (PFNGLGETBUFFERPARAMETERIVPROC)(*load)("glGetBufferParameteriv")
      ;
      glad_glGetBufferPointerv = (PFNGLGETBUFFERPOINTERVPROC)(*load)("glGetBufferPointerv");
    }
    if (GLAD_GL_VERSION_2_0 != 0) {
      glad_glBlendEquationSeparate =
           (PFNGLBLENDEQUATIONSEPARATEPROC)(*load)("glBlendEquationSeparate");
      glad_glDrawBuffers = (PFNGLDRAWBUFFERSPROC)(*load)("glDrawBuffers");
      glad_glStencilOpSeparate = (PFNGLSTENCILOPSEPARATEPROC)(*load)("glStencilOpSeparate");
      glad_glStencilFuncSeparate = (PFNGLSTENCILFUNCSEPARATEPROC)(*load)("glStencilFuncSeparate");
      glad_glStencilMaskSeparate = (PFNGLSTENCILMASKSEPARATEPROC)(*load)("glStencilMaskSeparate");
      glad_glAttachShader = (PFNGLATTACHSHADERPROC)(*load)("glAttachShader");
      glad_glBindAttribLocation = (PFNGLBINDATTRIBLOCATIONPROC)(*load)("glBindAttribLocation");
      glad_glCompileShader = (PFNGLCOMPILESHADERPROC)(*load)("glCompileShader");
      glad_glCreateProgram = (PFNGLCREATEPROGRAMPROC)(*load)("glCreateProgram");
      glad_glCreateShader = (PFNGLCREATESHADERPROC)(*load)("glCreateShader");
      glad_glDeleteProgram = (PFNGLDELETEPROGRAMPROC)(*load)("glDeleteProgram");
      glad_glDeleteShader = (PFNGLDELETESHADERPROC)(*load)("glDeleteShader");
      glad_glDetachShader = (PFNGLDETACHSHADERPROC)(*load)("glDetachShader");
      glad_glDisableVertexAttribArray =
           (PFNGLDISABLEVERTEXATTRIBARRAYPROC)(*load)("glDisableVertexAttribArray");
      glad_glEnableVertexAttribArray =
           (PFNGLENABLEVERTEXATTRIBARRAYPROC)(*load)("glEnableVertexAttribArray");
      glad_glGetActiveAttrib = (PFNGLGETACTIVEATTRIBPROC)(*load)("glGetActiveAttrib");
      glad_glGetActiveUniform = (PFNGLGETACTIVEUNIFORMPROC)(*load)("glGetActiveUniform");
      glad_glGetAttachedShaders = (PFNGLGETATTACHEDSHADERSPROC)(*load)("glGetAttachedShaders");
      glad_glGetAttribLocation = (PFNGLGETATTRIBLOCATIONPROC)(*load)("glGetAttribLocation");
      glad_glGetProgramiv = (PFNGLGETPROGRAMIVPROC)(*load)("glGetProgramiv");
      glad_glGetProgramInfoLog = (PFNGLGETPROGRAMINFOLOGPROC)(*load)("glGetProgramInfoLog");
      glad_glGetShaderiv = (PFNGLGETSHADERIVPROC)(*load)("glGetShaderiv");
      glad_glGetShaderInfoLog = (PFNGLGETSHADERINFOLOGPROC)(*load)("glGetShaderInfoLog");
      glad_glGetShaderSource = (PFNGLGETSHADERSOURCEPROC)(*load)("glGetShaderSource");
      glad_glGetUniformLocation = (PFNGLGETUNIFORMLOCATIONPROC)(*load)("glGetUniformLocation");
      glad_glGetUniformfv = (PFNGLGETUNIFORMFVPROC)(*load)("glGetUniformfv");
      glad_glGetUniformiv = (PFNGLGETUNIFORMIVPROC)(*load)("glGetUniformiv");
      glad_glGetVertexAttribdv = (PFNGLGETVERTEXATTRIBDVPROC)(*load)("glGetVertexAttribdv");
      glad_glGetVertexAttribfv = (PFNGLGETVERTEXATTRIBFVPROC)(*load)("glGetVertexAttribfv");
      glad_glGetVertexAttribiv = (PFNGLGETVERTEXATTRIBIVPROC)(*load)("glGetVertexAttribiv");
      glad_glGetVertexAttribPointerv =
           (PFNGLGETVERTEXATTRIBPOINTERVPROC)(*load)("glGetVertexAttribPointerv");
      glad_glIsProgram = (PFNGLISPROGRAMPROC)(*load)("glIsProgram");
      glad_glIsShader = (PFNGLISSHADERPROC)(*load)("glIsShader");
      glad_glLinkProgram = (PFNGLLINKPROGRAMPROC)(*load)("glLinkProgram");
      glad_glShaderSource = (PFNGLSHADERSOURCEPROC)(*load)("glShaderSource");
      glad_glUseProgram = (PFNGLUSEPROGRAMPROC)(*load)("glUseProgram");
      glad_glUniform1f = (PFNGLUNIFORM1FPROC)(*load)("glUniform1f");
      glad_glUniform2f = (PFNGLUNIFORM2FPROC)(*load)("glUniform2f");
      glad_glUniform3f = (PFNGLUNIFORM3FPROC)(*load)("glUniform3f");
      glad_glUniform4f = (PFNGLUNIFORM4FPROC)(*load)("glUniform4f");
      glad_glUniform1i = (PFNGLUNIFORM1IPROC)(*load)("glUniform1i");
      glad_glUniform2i = (PFNGLUNIFORM2IPROC)(*load)("glUniform2i");
      glad_glUniform3i = (PFNGLUNIFORM3IPROC)(*load)("glUniform3i");
      glad_glUniform4i = (PFNGLUNIFORM4IPROC)(*load)("glUniform4i");
      glad_glUniform1fv = (PFNGLUNIFORM1FVPROC)(*load)("glUniform1fv");
      glad_glUniform2fv = (PFNGLUNIFORM2FVPROC)(*load)("glUniform2fv");
      glad_glUniform3fv = (PFNGLUNIFORM3FVPROC)(*load)("glUniform3fv");
      glad_glUniform4fv = (PFNGLUNIFORM4FVPROC)(*load)("glUniform4fv");
      glad_glUniform1iv = (PFNGLUNIFORM1IVPROC)(*load)("glUniform1iv");
      glad_glUniform2iv = (PFNGLUNIFORM2IVPROC)(*load)("glUniform2iv");
      glad_glUniform3iv = (PFNGLUNIFORM3IVPROC)(*load)("glUniform3iv");
      glad_glUniform4iv = (PFNGLUNIFORM4IVPROC)(*load)("glUniform4iv");
      glad_glUniformMatrix2fv = (PFNGLUNIFORMMATRIX2FVPROC)(*load)("glUniformMatrix2fv");
      glad_glUniformMatrix3fv = (PFNGLUNIFORMMATRIX3FVPROC)(*load)("glUniformMatrix3fv");
      glad_glUniformMatrix4fv = (PFNGLUNIFORMMATRIX4FVPROC)(*load)("glUniformMatrix4fv");
      glad_glValidateProgram = (PFNGLVALIDATEPROGRAMPROC)(*load)("glValidateProgram");
      glad_glVertexAttrib1d = (PFNGLVERTEXATTRIB1DPROC)(*load)("glVertexAttrib1d");
      glad_glVertexAttrib1dv = (PFNGLVERTEXATTRIB1DVPROC)(*load)("glVertexAttrib1dv");
      glad_glVertexAttrib1f = (PFNGLVERTEXATTRIB1FPROC)(*load)("glVertexAttrib1f");
      glad_glVertexAttrib1fv = (PFNGLVERTEXATTRIB1FVPROC)(*load)("glVertexAttrib1fv");
      glad_glVertexAttrib1s = (PFNGLVERTEXATTRIB1SPROC)(*load)("glVertexAttrib1s");
      glad_glVertexAttrib1sv = (PFNGLVERTEXATTRIB1SVPROC)(*load)("glVertexAttrib1sv");
      glad_glVertexAttrib2d = (PFNGLVERTEXATTRIB2DPROC)(*load)("glVertexAttrib2d");
      glad_glVertexAttrib2dv = (PFNGLVERTEXATTRIB2DVPROC)(*load)("glVertexAttrib2dv");
      glad_glVertexAttrib2f = (PFNGLVERTEXATTRIB2FPROC)(*load)("glVertexAttrib2f");
      glad_glVertexAttrib2fv = (PFNGLVERTEXATTRIB2FVPROC)(*load)("glVertexAttrib2fv");
      glad_glVertexAttrib2s = (PFNGLVERTEXATTRIB2SPROC)(*load)("glVertexAttrib2s");
      glad_glVertexAttrib2sv = (PFNGLVERTEXATTRIB2SVPROC)(*load)("glVertexAttrib2sv");
      glad_glVertexAttrib3d = (PFNGLVERTEXATTRIB3DPROC)(*load)("glVertexAttrib3d");
      glad_glVertexAttrib3dv = (PFNGLVERTEXATTRIB3DVPROC)(*load)("glVertexAttrib3dv");
      glad_glVertexAttrib3f = (PFNGLVERTEXATTRIB3FPROC)(*load)("glVertexAttrib3f");
      glad_glVertexAttrib3fv = (PFNGLVERTEXATTRIB3FVPROC)(*load)("glVertexAttrib3fv");
      glad_glVertexAttrib3s = (PFNGLVERTEXATTRIB3SPROC)(*load)("glVertexAttrib3s");
      glad_glVertexAttrib3sv = (PFNGLVERTEXATTRIB3SVPROC)(*load)("glVertexAttrib3sv");
      glad_glVertexAttrib4Nbv = (PFNGLVERTEXATTRIB4NBVPROC)(*load)("glVertexAttrib4Nbv");
      glad_glVertexAttrib4Niv = (PFNGLVERTEXATTRIB4NIVPROC)(*load)("glVertexAttrib4Niv");
      glad_glVertexAttrib4Nsv = (PFNGLVERTEXATTRIB4NSVPROC)(*load)("glVertexAttrib4Nsv");
      glad_glVertexAttrib4Nub = (PFNGLVERTEXATTRIB4NUBPROC)(*load)("glVertexAttrib4Nub");
      glad_glVertexAttrib4Nubv = (PFNGLVERTEXATTRIB4NUBVPROC)(*load)("glVertexAttrib4Nubv");
      glad_glVertexAttrib4Nuiv = (PFNGLVERTEXATTRIB4NUIVPROC)(*load)("glVertexAttrib4Nuiv");
      glad_glVertexAttrib4Nusv = (PFNGLVERTEXATTRIB4NUSVPROC)(*load)("glVertexAttrib4Nusv");
      glad_glVertexAttrib4bv = (PFNGLVERTEXATTRIB4BVPROC)(*load)("glVertexAttrib4bv");
      glad_glVertexAttrib4d = (PFNGLVERTEXATTRIB4DPROC)(*load)("glVertexAttrib4d");
      glad_glVertexAttrib4dv = (PFNGLVERTEXATTRIB4DVPROC)(*load)("glVertexAttrib4dv");
      glad_glVertexAttrib4f = (PFNGLVERTEXATTRIB4FPROC)(*load)("glVertexAttrib4f");
      glad_glVertexAttrib4fv = (PFNGLVERTEXATTRIB4FVPROC)(*load)("glVertexAttrib4fv");
      glad_glVertexAttrib4iv = (PFNGLVERTEXATTRIB4IVPROC)(*load)("glVertexAttrib4iv");
      glad_glVertexAttrib4s = (PFNGLVERTEXATTRIB4SPROC)(*load)("glVertexAttrib4s");
      glad_glVertexAttrib4sv = (PFNGLVERTEXATTRIB4SVPROC)(*load)("glVertexAttrib4sv");
      glad_glVertexAttrib4ubv = (PFNGLVERTEXATTRIB4UBVPROC)(*load)("glVertexAttrib4ubv");
      glad_glVertexAttrib4uiv = (PFNGLVERTEXATTRIB4UIVPROC)(*load)("glVertexAttrib4uiv");
      glad_glVertexAttrib4usv = (PFNGLVERTEXATTRIB4USVPROC)(*load)("glVertexAttrib4usv");
      glad_glVertexAttribPointer = (PFNGLVERTEXATTRIBPOINTERPROC)(*load)("glVertexAttribPointer");
    }
    if (GLAD_GL_VERSION_2_1 != 0) {
      glad_glUniformMatrix2x3fv = (PFNGLUNIFORMMATRIX2X3FVPROC)(*load)("glUniformMatrix2x3fv");
      glad_glUniformMatrix3x2fv = (PFNGLUNIFORMMATRIX3X2FVPROC)(*load)("glUniformMatrix3x2fv");
      glad_glUniformMatrix2x4fv = (PFNGLUNIFORMMATRIX2X4FVPROC)(*load)("glUniformMatrix2x4fv");
      glad_glUniformMatrix4x2fv = (PFNGLUNIFORMMATRIX4X2FVPROC)(*load)("glUniformMatrix4x2fv");
      glad_glUniformMatrix3x4fv = (PFNGLUNIFORMMATRIX3X4FVPROC)(*load)("glUniformMatrix3x4fv");
      glad_glUniformMatrix4x3fv = (PFNGLUNIFORMMATRIX4X3FVPROC)(*load)("glUniformMatrix4x3fv");
    }
    if (GLAD_GL_VERSION_3_0 != 0) {
      glad_glColorMaski = (PFNGLCOLORMASKIPROC)(*load)("glColorMaski");
      glad_glGetBooleani_v = (PFNGLGETBOOLEANI_VPROC)(*load)("glGetBooleani_v");
      glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)(*load)("glGetIntegeri_v");
      glad_glEnablei = (PFNGLENABLEIPROC)(*load)("glEnablei");
      glad_glDisablei = (PFNGLDISABLEIPROC)(*load)("glDisablei");
      glad_glIsEnabledi = (PFNGLISENABLEDIPROC)(*load)("glIsEnabledi");
      glad_glBeginTransformFeedback =
           (PFNGLBEGINTRANSFORMFEEDBACKPROC)(*load)("glBeginTransformFeedback");
      glad_glEndTransformFeedback = (PFNGLENDTRANSFORMFEEDBACKPROC)(*load)("glEndTransformFeedback")
      ;
      glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*load)("glBindBufferRange");
      glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*load)("glBindBufferBase");
      glad_glTransformFeedbackVaryings =
           (PFNGLTRANSFORMFEEDBACKVARYINGSPROC)(*load)("glTransformFeedbackVaryings");
      glad_glGetTransformFeedbackVarying =
           (PFNGLGETTRANSFORMFEEDBACKVARYINGPROC)(*load)("glGetTransformFeedbackVarying");
      glad_glClampColor = (PFNGLCLAMPCOLORPROC)(*load)("glClampColor");
      glad_glBeginConditionalRender =
           (PFNGLBEGINCONDITIONALRENDERPROC)(*load)("glBeginConditionalRender");
      glad_glEndConditionalRender = (PFNGLENDCONDITIONALRENDERPROC)(*load)("glEndConditionalRender")
      ;
      glad_glVertexAttribIPointer = (PFNGLVERTEXATTRIBIPOINTERPROC)(*load)("glVertexAttribIPointer")
      ;
      glad_glGetVertexAttribIiv = (PFNGLGETVERTEXATTRIBIIVPROC)(*load)("glGetVertexAttribIiv");
      glad_glGetVertexAttribIuiv = (PFNGLGETVERTEXATTRIBIUIVPROC)(*load)("glGetVertexAttribIuiv");
      glad_glVertexAttribI1i = (PFNGLVERTEXATTRIBI1IPROC)(*load)("glVertexAttribI1i");
      glad_glVertexAttribI2i = (PFNGLVERTEXATTRIBI2IPROC)(*load)("glVertexAttribI2i");
      glad_glVertexAttribI3i = (PFNGLVERTEXATTRIBI3IPROC)(*load)("glVertexAttribI3i");
      glad_glVertexAttribI4i = (PFNGLVERTEXATTRIBI4IPROC)(*load)("glVertexAttribI4i");
      glad_glVertexAttribI1ui = (PFNGLVERTEXATTRIBI1UIPROC)(*load)("glVertexAttribI1ui");
      glad_glVertexAttribI2ui = (PFNGLVERTEXATTRIBI2UIPROC)(*load)("glVertexAttribI2ui");
      glad_glVertexAttribI3ui = (PFNGLVERTEXATTRIBI3UIPROC)(*load)("glVertexAttribI3ui");
      glad_glVertexAttribI4ui = (PFNGLVERTEXATTRIBI4UIPROC)(*load)("glVertexAttribI4ui");
      glad_glVertexAttribI1iv = (PFNGLVERTEXATTRIBI1IVPROC)(*load)("glVertexAttribI1iv");
      glad_glVertexAttribI2iv = (PFNGLVERTEXATTRIBI2IVPROC)(*load)("glVertexAttribI2iv");
      glad_glVertexAttribI3iv = (PFNGLVERTEXATTRIBI3IVPROC)(*load)("glVertexAttribI3iv");
      glad_glVertexAttribI4iv = (PFNGLVERTEXATTRIBI4IVPROC)(*load)("glVertexAttribI4iv");
      glad_glVertexAttribI1uiv = (PFNGLVERTEXATTRIBI1UIVPROC)(*load)("glVertexAttribI1uiv");
      glad_glVertexAttribI2uiv = (PFNGLVERTEXATTRIBI2UIVPROC)(*load)("glVertexAttribI2uiv");
      glad_glVertexAttribI3uiv = (PFNGLVERTEXATTRIBI3UIVPROC)(*load)("glVertexAttribI3uiv");
      glad_glVertexAttribI4uiv = (PFNGLVERTEXATTRIBI4UIVPROC)(*load)("glVertexAttribI4uiv");
      glad_glVertexAttribI4bv = (PFNGLVERTEXATTRIBI4BVPROC)(*load)("glVertexAttribI4bv");
      glad_glVertexAttribI4sv = (PFNGLVERTEXATTRIBI4SVPROC)(*load)("glVertexAttribI4sv");
      glad_glVertexAttribI4ubv = (PFNGLVERTEXATTRIBI4UBVPROC)(*load)("glVertexAttribI4ubv");
      glad_glVertexAttribI4usv = (PFNGLVERTEXATTRIBI4USVPROC)(*load)("glVertexAttribI4usv");
      glad_glGetUniformuiv = (PFNGLGETUNIFORMUIVPROC)(*load)("glGetUniformuiv");
      glad_glBindFragDataLocation = (PFNGLBINDFRAGDATALOCATIONPROC)(*load)("glBindFragDataLocation")
      ;
      glad_glGetFragDataLocation = (PFNGLGETFRAGDATALOCATIONPROC)(*load)("glGetFragDataLocation");
      glad_glUniform1ui = (PFNGLUNIFORM1UIPROC)(*load)("glUniform1ui");
      glad_glUniform2ui = (PFNGLUNIFORM2UIPROC)(*load)("glUniform2ui");
      glad_glUniform3ui = (PFNGLUNIFORM3UIPROC)(*load)("glUniform3ui");
      glad_glUniform4ui = (PFNGLUNIFORM4UIPROC)(*load)("glUniform4ui");
      glad_glUniform1uiv = (PFNGLUNIFORM1UIVPROC)(*load)("glUniform1uiv");
      glad_glUniform2uiv = (PFNGLUNIFORM2UIVPROC)(*load)("glUniform2uiv");
      glad_glUniform3uiv = (PFNGLUNIFORM3UIVPROC)(*load)("glUniform3uiv");
      glad_glUniform4uiv = (PFNGLUNIFORM4UIVPROC)(*load)("glUniform4uiv");
      glad_glTexParameterIiv = (PFNGLTEXPARAMETERIIVPROC)(*load)("glTexParameterIiv");
      glad_glTexParameterIuiv = (PFNGLTEXPARAMETERIUIVPROC)(*load)("glTexParameterIuiv");
      glad_glGetTexParameterIiv = (PFNGLGETTEXPARAMETERIIVPROC)(*load)("glGetTexParameterIiv");
      glad_glGetTexParameterIuiv = (PFNGLGETTEXPARAMETERIUIVPROC)(*load)("glGetTexParameterIuiv");
      glad_glClearBufferiv = (PFNGLCLEARBUFFERIVPROC)(*load)("glClearBufferiv");
      glad_glClearBufferuiv = (PFNGLCLEARBUFFERUIVPROC)(*load)("glClearBufferuiv");
      glad_glClearBufferfv = (PFNGLCLEARBUFFERFVPROC)(*load)("glClearBufferfv");
      glad_glClearBufferfi = (PFNGLCLEARBUFFERFIPROC)(*load)("glClearBufferfi");
      glad_glGetStringi = (PFNGLGETSTRINGIPROC)(*load)("glGetStringi");
      glad_glIsRenderbuffer = (PFNGLISRENDERBUFFERPROC)(*load)("glIsRenderbuffer");
      glad_glBindRenderbuffer = (PFNGLBINDRENDERBUFFERPROC)(*load)("glBindRenderbuffer");
      glad_glDeleteRenderbuffers = (PFNGLDELETERENDERBUFFERSPROC)(*load)("glDeleteRenderbuffers");
      glad_glGenRenderbuffers = (PFNGLGENRENDERBUFFERSPROC)(*load)("glGenRenderbuffers");
      glad_glRenderbufferStorage = (PFNGLRENDERBUFFERSTORAGEPROC)(*load)("glRenderbufferStorage");
      glad_glGetRenderbufferParameteriv =
           (PFNGLGETRENDERBUFFERPARAMETERIVPROC)(*load)("glGetRenderbufferParameteriv");
      glad_glIsFramebuffer = (PFNGLISFRAMEBUFFERPROC)(*load)("glIsFramebuffer");
      glad_glBindFramebuffer = (PFNGLBINDFRAMEBUFFERPROC)(*load)("glBindFramebuffer");
      glad_glDeleteFramebuffers = (PFNGLDELETEFRAMEBUFFERSPROC)(*load)("glDeleteFramebuffers");
      glad_glGenFramebuffers = (PFNGLGENFRAMEBUFFERSPROC)(*load)("glGenFramebuffers");
      glad_glCheckFramebufferStatus =
           (PFNGLCHECKFRAMEBUFFERSTATUSPROC)(*load)("glCheckFramebufferStatus");
      glad_glFramebufferTexture1D = (PFNGLFRAMEBUFFERTEXTURE1DPROC)(*load)("glFramebufferTexture1D")
      ;
      glad_glFramebufferTexture2D = (PFNGLFRAMEBUFFERTEXTURE2DPROC)(*load)("glFramebufferTexture2D")
      ;
      glad_glFramebufferTexture3D = (PFNGLFRAMEBUFFERTEXTURE3DPROC)(*load)("glFramebufferTexture3D")
      ;
      glad_glFramebufferRenderbuffer =
           (PFNGLFRAMEBUFFERRENDERBUFFERPROC)(*load)("glFramebufferRenderbuffer");
      glad_glGetFramebufferAttachmentParameteriv =
           (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVPROC)
           (*load)("glGetFramebufferAttachmentParameteriv");
      glad_glGenerateMipmap = (PFNGLGENERATEMIPMAPPROC)(*load)("glGenerateMipmap");
      glad_glBlitFramebuffer = (PFNGLBLITFRAMEBUFFERPROC)(*load)("glBlitFramebuffer");
      glad_glRenderbufferStorageMultisample =
           (PFNGLRENDERBUFFERSTORAGEMULTISAMPLEPROC)(*load)("glRenderbufferStorageMultisample");
      glad_glFramebufferTextureLayer =
           (PFNGLFRAMEBUFFERTEXTURELAYERPROC)(*load)("glFramebufferTextureLayer");
      glad_glMapBufferRange = (PFNGLMAPBUFFERRANGEPROC)(*load)("glMapBufferRange");
      glad_glFlushMappedBufferRange =
           (PFNGLFLUSHMAPPEDBUFFERRANGEPROC)(*load)("glFlushMappedBufferRange");
      glad_glBindVertexArray = (PFNGLBINDVERTEXARRAYPROC)(*load)("glBindVertexArray");
      glad_glDeleteVertexArrays = (PFNGLDELETEVERTEXARRAYSPROC)(*load)("glDeleteVertexArrays");
      glad_glGenVertexArrays = (PFNGLGENVERTEXARRAYSPROC)(*load)("glGenVertexArrays");
      glad_glIsVertexArray = (PFNGLISVERTEXARRAYPROC)(*load)("glIsVertexArray");
    }
    if (GLAD_GL_VERSION_3_1 != 0) {
      glad_glDrawArraysInstanced = (PFNGLDRAWARRAYSINSTANCEDPROC)(*load)("glDrawArraysInstanced");
      glad_glDrawElementsInstanced =
           (PFNGLDRAWELEMENTSINSTANCEDPROC)(*load)("glDrawElementsInstanced");
      glad_glTexBuffer = (PFNGLTEXBUFFERPROC)(*load)("glTexBuffer");
      glad_glPrimitiveRestartIndex =
           (PFNGLPRIMITIVERESTARTINDEXPROC)(*load)("glPrimitiveRestartIndex");
      glad_glCopyBufferSubData = (PFNGLCOPYBUFFERSUBDATAPROC)(*load)("glCopyBufferSubData");
      glad_glGetUniformIndices = (PFNGLGETUNIFORMINDICESPROC)(*load)("glGetUniformIndices");
      glad_glGetActiveUniformsiv = (PFNGLGETACTIVEUNIFORMSIVPROC)(*load)("glGetActiveUniformsiv");
      glad_glGetActiveUniformName = (PFNGLGETACTIVEUNIFORMNAMEPROC)(*load)("glGetActiveUniformName")
      ;
      glad_glGetUniformBlockIndex = (PFNGLGETUNIFORMBLOCKINDEXPROC)(*load)("glGetUniformBlockIndex")
      ;
      glad_glGetActiveUniformBlockiv =
           (PFNGLGETACTIVEUNIFORMBLOCKIVPROC)(*load)("glGetActiveUniformBlockiv");
      glad_glGetActiveUniformBlockName =
           (PFNGLGETACTIVEUNIFORMBLOCKNAMEPROC)(*load)("glGetActiveUniformBlockName");
      glad_glUniformBlockBinding = (PFNGLUNIFORMBLOCKBINDINGPROC)(*load)("glUniformBlockBinding");
      glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*load)("glBindBufferRange");
      glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*load)("glBindBufferBase");
      glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)(*load)("glGetIntegeri_v");
    }
    if (GLAD_GL_VERSION_3_2 != 0) {
      glad_glDrawElementsBaseVertex =
           (PFNGLDRAWELEMENTSBASEVERTEXPROC)(*load)("glDrawElementsBaseVertex");
      glad_glDrawRangeElementsBaseVertex =
           (PFNGLDRAWRANGEELEMENTSBASEVERTEXPROC)(*load)("glDrawRangeElementsBaseVertex");
      glad_glDrawElementsInstancedBaseVertex =
           (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXPROC)(*load)("glDrawElementsInstancedBaseVertex");
      glad_glMultiDrawElementsBaseVertex =
           (PFNGLMULTIDRAWELEMENTSBASEVERTEXPROC)(*load)("glMultiDrawElementsBaseVertex");
      glad_glProvokingVertex = (PFNGLPROVOKINGVERTEXPROC)(*load)("glProvokingVertex");
      glad_glFenceSync = (PFNGLFENCESYNCPROC)(*load)("glFenceSync");
      glad_glIsSync = (PFNGLISSYNCPROC)(*load)("glIsSync");
      glad_glDeleteSync = (PFNGLDELETESYNCPROC)(*load)("glDeleteSync");
      glad_glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC)(*load)("glClientWaitSync");
      glad_glWaitSync = (PFNGLWAITSYNCPROC)(*load)("glWaitSync");
      glad_glGetInteger64v = (PFNGLGETINTEGER64VPROC)(*load)("glGetInteger64v");
      glad_glGetSynciv = (PFNGLGETSYNCIVPROC)(*load)("glGetSynciv");
      glad_glGetInteger64i_v = (PFNGLGETINTEGER64I_VPROC)(*load)("glGetInteger64i_v");
      glad_glGetBufferParameteri64v =
           (PFNGLGETBUFFERPARAMETERI64VPROC)(*load)("glGetBufferParameteri64v");
      glad_glFramebufferTexture = (PFNGLFRAMEBUFFERTEXTUREPROC)(*load)("glFramebufferTexture");
      glad_glTexImage2DMultisample =
           (PFNGLTEXIMAGE2DMULTISAMPLEPROC)(*load)("glTexImage2DMultisample");
      glad_glTexImage3DMultisample =
           (PFNGLTEXIMAGE3DMULTISAMPLEPROC)(*load)("glTexImage3DMultisample");
      glad_glGetMultisamplefv = (PFNGLGETMULTISAMPLEFVPROC)(*load)("glGetMultisamplefv");
      glad_glSampleMaski = (PFNGLSAMPLEMASKIPROC)(*load)("glSampleMaski");
    }
    if (GLAD_GL_VERSION_3_3 != 0) {
      glad_glBindFragDataLocationIndexed =
           (PFNGLBINDFRAGDATALOCATIONINDEXEDPROC)(*load)("glBindFragDataLocationIndexed");
      glad_glGetFragDataIndex = (PFNGLGETFRAGDATAINDEXPROC)(*load)("glGetFragDataIndex");
      glad_glGenSamplers = (PFNGLGENSAMPLERSPROC)(*load)("glGenSamplers");
      glad_glDeleteSamplers = (PFNGLDELETESAMPLERSPROC)(*load)("glDeleteSamplers");
      glad_glIsSampler = (PFNGLISSAMPLERPROC)(*load)("glIsSampler");
      glad_glBindSampler = (PFNGLBINDSAMPLERPROC)(*load)("glBindSampler");
      glad_glSamplerParameteri = (PFNGLSAMPLERPARAMETERIPROC)(*load)("glSamplerParameteri");
      glad_glSamplerParameteriv = (PFNGLSAMPLERPARAMETERIVPROC)(*load)("glSamplerParameteriv");
      glad_glSamplerParameterf = (PFNGLSAMPLERPARAMETERFPROC)(*load)("glSamplerParameterf");
      glad_glSamplerParameterfv = (PFNGLSAMPLERPARAMETERFVPROC)(*load)("glSamplerParameterfv");
      glad_glSamplerParameterIiv = (PFNGLSAMPLERPARAMETERIIVPROC)(*load)("glSamplerParameterIiv");
      glad_glSamplerParameterIuiv = (PFNGLSAMPLERPARAMETERIUIVPROC)(*load)("glSamplerParameterIuiv")
      ;
      glad_glGetSamplerParameteriv =
           (PFNGLGETSAMPLERPARAMETERIVPROC)(*load)("glGetSamplerParameteriv");
      glad_glGetSamplerParameterIiv =
           (PFNGLGETSAMPLERPARAMETERIIVPROC)(*load)("glGetSamplerParameterIiv");
      glad_glGetSamplerParameterfv =
           (PFNGLGETSAMPLERPARAMETERFVPROC)(*load)("glGetSamplerParameterfv");
      glad_glGetSamplerParameterIuiv =
           (PFNGLGETSAMPLERPARAMETERIUIVPROC)(*load)("glGetSamplerParameterIuiv");
      glad_glQueryCounter = (PFNGLQUERYCOUNTERPROC)(*load)("glQueryCounter");
      glad_glGetQueryObjecti64v = (PFNGLGETQUERYOBJECTI64VPROC)(*load)("glGetQueryObjecti64v");
      glad_glGetQueryObjectui64v = (PFNGLGETQUERYOBJECTUI64VPROC)(*load)("glGetQueryObjectui64v");
      glad_glVertexAttribDivisor = (PFNGLVERTEXATTRIBDIVISORPROC)(*load)("glVertexAttribDivisor");
      glad_glVertexAttribP1ui = (PFNGLVERTEXATTRIBP1UIPROC)(*load)("glVertexAttribP1ui");
      glad_glVertexAttribP1uiv = (PFNGLVERTEXATTRIBP1UIVPROC)(*load)("glVertexAttribP1uiv");
      glad_glVertexAttribP2ui = (PFNGLVERTEXATTRIBP2UIPROC)(*load)("glVertexAttribP2ui");
      glad_glVertexAttribP2uiv = (PFNGLVERTEXATTRIBP2UIVPROC)(*load)("glVertexAttribP2uiv");
      glad_glVertexAttribP3ui = (PFNGLVERTEXATTRIBP3UIPROC)(*load)("glVertexAttribP3ui");
      glad_glVertexAttribP3uiv = (PFNGLVERTEXATTRIBP3UIVPROC)(*load)("glVertexAttribP3uiv");
      glad_glVertexAttribP4ui = (PFNGLVERTEXATTRIBP4UIPROC)(*load)("glVertexAttribP4ui");
      glad_glVertexAttribP4uiv = (PFNGLVERTEXATTRIBP4UIVPROC)(*load)("glVertexAttribP4uiv");
      glad_glVertexP2ui = (PFNGLVERTEXP2UIPROC)(*load)("glVertexP2ui");
      glad_glVertexP2uiv = (PFNGLVERTEXP2UIVPROC)(*load)("glVertexP2uiv");
      glad_glVertexP3ui = (PFNGLVERTEXP3UIPROC)(*load)("glVertexP3ui");
      glad_glVertexP3uiv = (PFNGLVERTEXP3UIVPROC)(*load)("glVertexP3uiv");
      glad_glVertexP4ui = (PFNGLVERTEXP4UIPROC)(*load)("glVertexP4ui");
      glad_glVertexP4uiv = (PFNGLVERTEXP4UIVPROC)(*load)("glVertexP4uiv");
      glad_glTexCoordP1ui = (PFNGLTEXCOORDP1UIPROC)(*load)("glTexCoordP1ui");
      glad_glTexCoordP1uiv = (PFNGLTEXCOORDP1UIVPROC)(*load)("glTexCoordP1uiv");
      glad_glTexCoordP2ui = (PFNGLTEXCOORDP2UIPROC)(*load)("glTexCoordP2ui");
      glad_glTexCoordP2uiv = (PFNGLTEXCOORDP2UIVPROC)(*load)("glTexCoordP2uiv");
      glad_glTexCoordP3ui = (PFNGLTEXCOORDP3UIPROC)(*load)("glTexCoordP3ui");
      glad_glTexCoordP3uiv = (PFNGLTEXCOORDP3UIVPROC)(*load)("glTexCoordP3uiv");
      glad_glTexCoordP4ui = (PFNGLTEXCOORDP4UIPROC)(*load)("glTexCoordP4ui");
      glad_glTexCoordP4uiv = (PFNGLTEXCOORDP4UIVPROC)(*load)("glTexCoordP4uiv");
      glad_glMultiTexCoordP1ui = (PFNGLMULTITEXCOORDP1UIPROC)(*load)("glMultiTexCoordP1ui");
      glad_glMultiTexCoordP1uiv = (PFNGLMULTITEXCOORDP1UIVPROC)(*load)("glMultiTexCoordP1uiv");
      glad_glMultiTexCoordP2ui = (PFNGLMULTITEXCOORDP2UIPROC)(*load)("glMultiTexCoordP2ui");
      glad_glMultiTexCoordP2uiv = (PFNGLMULTITEXCOORDP2UIVPROC)(*load)("glMultiTexCoordP2uiv");
      glad_glMultiTexCoordP3ui = (PFNGLMULTITEXCOORDP3UIPROC)(*load)("glMultiTexCoordP3ui");
      glad_glMultiTexCoordP3uiv = (PFNGLMULTITEXCOORDP3UIVPROC)(*load)("glMultiTexCoordP3uiv");
      glad_glMultiTexCoordP4ui = (PFNGLMULTITEXCOORDP4UIPROC)(*load)("glMultiTexCoordP4ui");
      glad_glMultiTexCoordP4uiv = (PFNGLMULTITEXCOORDP4UIVPROC)(*load)("glMultiTexCoordP4uiv");
      glad_glNormalP3ui = (PFNGLNORMALP3UIPROC)(*load)("glNormalP3ui");
      glad_glNormalP3uiv = (PFNGLNORMALP3UIVPROC)(*load)("glNormalP3uiv");
      glad_glColorP3ui = (PFNGLCOLORP3UIPROC)(*load)("glColorP3ui");
      glad_glColorP3uiv = (PFNGLCOLORP3UIVPROC)(*load)("glColorP3uiv");
      glad_glColorP4ui = (PFNGLCOLORP4UIPROC)(*load)("glColorP4ui");
      glad_glColorP4uiv = (PFNGLCOLORP4UIVPROC)(*load)("glColorP4uiv");
      glad_glSecondaryColorP3ui = (PFNGLSECONDARYCOLORP3UIPROC)(*load)("glSecondaryColorP3ui");
      glad_glSecondaryColorP3uiv = (PFNGLSECONDARYCOLORP3UIVPROC)(*load)("glSecondaryColorP3uiv");
    }
    if (max_loaded_major < 3) {
      exts = (char *)(*glad_glGetString)(0x1f03);
    }
    else {
      num_exts_i = 0;
      (*glad_glGetIntegerv)(0x821d,&num_exts_i);
      if (0 < (long)num_exts_i) {
        exts_i = (char **)realloc(exts_i,(long)num_exts_i << 3);
      }
      if (exts_i == (char **)0x0) {
        return 0;
      }
      if (num_exts_i != 0) {
        uVar6 = 0;
        do {
          pGVar3 = (*glad_glGetStringi)(0x1f03,(GLuint)uVar6);
          sVar4 = strlen((char *)pGVar3);
          pcVar5 = (char *)malloc(sVar4 + 1);
          if (pcVar5 != (char *)0x0) {
            memcpy(pcVar5,pGVar3,sVar4 + 1);
          }
          exts_i[uVar6] = pcVar5;
          uVar6 = uVar6 + 1;
        } while (uVar6 < (uint)num_exts_i);
      }
    }
    __ptr = exts_i;
    if (exts_i != (char **)0x0) {
      if (0 < num_exts_i) {
        lVar8 = 0;
        do {
          free(__ptr[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 < num_exts_i);
      }
      free(__ptr);
      exts_i = (char **)0x0;
    }
    uVar2 = (uint)(GLVersion.minor != 0 || GLVersion.major != 0);
  }
  return uVar2;
}

Assistant:

int gladLoadGLLoader(GLADloadproc load) {
	GLVersion.major = 0; GLVersion.minor = 0;
	glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	if(glGetString == NULL) return 0;
	if(glGetString(GL_VERSION) == NULL) return 0;
	find_coreGL();
	load_GL_VERSION_1_0(load);
	load_GL_VERSION_1_1(load);
	load_GL_VERSION_1_2(load);
	load_GL_VERSION_1_3(load);
	load_GL_VERSION_1_4(load);
	load_GL_VERSION_1_5(load);
	load_GL_VERSION_2_0(load);
	load_GL_VERSION_2_1(load);
	load_GL_VERSION_3_0(load);
	load_GL_VERSION_3_1(load);
	load_GL_VERSION_3_2(load);
	load_GL_VERSION_3_3(load);

	if (!find_extensionsGL()) return 0;
	return GLVersion.major != 0 || GLVersion.minor != 0;
}